

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzhierarquicalgrid.cpp
# Opt level: O0

TPZGeoMesh * __thiscall
TPZHierarquicalGrid::ComputeExtrusion(TPZHierarquicalGrid *this,REAL t,REAL dt,int n)

{
  int iVar1;
  void *pvVar2;
  int64_t iVar3;
  double *pdVar4;
  TPZGeoMesh *pTVar5;
  TPZFunction<double> *pTVar6;
  long lVar7;
  TPZGeoEl **ppTVar8;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar9;
  double in_XMM1_Qa;
  TPZGeoMesh *in_stack_000000b0;
  int ielMatId;
  int ielDim;
  int iel;
  int elid;
  TPZVec<double> Coordinates;
  TPZVec<double> NewCoordinates;
  TPZVec<double> NewCoordinates_r;
  TPZVec<double> tpara;
  int inode;
  int il;
  REAL sing;
  int nodeId;
  int NNodesBase;
  int *in_stack_00000cf8;
  int in_stack_00000d00;
  int in_stack_00000d04;
  int in_stack_00000d08;
  int in_stack_00000d0c;
  TPZHierarquicalGrid *in_stack_00000d10;
  int64_t in_stack_fffffffffffffd88;
  TPZVec<double> *in_stack_fffffffffffffd90;
  TPZGeoNode *in_stack_fffffffffffffd98;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffda0;
  TPZGeoNode *in_stack_fffffffffffffda8;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffdb0;
  TPZGeoMesh *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffe18;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  TPZVec<TPZAutoPointer<TPZGeoMesh>_> *in_stack_fffffffffffffe60;
  int local_e8;
  TPZVec<double> local_d8;
  undefined8 local_b8;
  TPZVec<double> local_b0;
  undefined8 local_90;
  TPZVec<double> local_88;
  TPZVec<double> local_68;
  int local_48;
  int local_44;
  double local_40;
  int local_34;
  int local_30;
  int local_1c;
  double local_18;
  double local_10;
  
  iVar1 = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  local_1c = in_ESI;
  local_18 = in_XMM1_Qa;
  local_10 = in_XMM0_Qa;
  TPZVec<TPZAutoPointer<TPZGeoMesh>_>::Resize
            (in_stack_fffffffffffffe60,CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)
            );
  pvVar2 = operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(in_stack_fffffffffffffdc0);
  *(void **)(in_RDI + 0x38) = pvVar2;
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 0x40));
  iVar3 = TPZGeoMesh::NNodes((TPZGeoMesh *)0x1f691e1);
  local_30 = (int)iVar3;
  TPZGeoMesh::NodeVec(*(TPZGeoMesh **)(in_RDI + 0x38));
  TPZAdmChunkVector<TPZGeoNode,_10>::Resize(in_stack_fffffffffffffe20,iVar1);
  local_34 = 0;
  local_40 = 1.0;
  local_44 = 0;
  do {
    if (local_1c + 1 <= local_44) {
      TPZGeoMesh::SetMaxNodeId(*(TPZGeoMesh **)(in_RDI + 0x38),(long)local_34);
      local_e8 = 0;
      while( true ) {
        lVar7 = (long)local_e8;
        TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 0x40));
        iVar3 = TPZGeoMesh::NElements((TPZGeoMesh *)0x1f69b42);
        if (iVar3 <= lVar7) break;
        pTVar5 = TPZAutoPointer<TPZGeoMesh>::operator->
                           ((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 0x40));
        TPZGeoMesh::ElementVec(pTVar5);
        ppTVar8 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                            ((TPZChunkVector<TPZGeoEl_*,_10> *)in_stack_fffffffffffffdb0,
                             (int64_t)in_stack_fffffffffffffda8);
        (**(code **)(*(long *)*ppTVar8 + 0x210))();
        pTVar5 = TPZAutoPointer<TPZGeoMesh>::operator->
                           ((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 0x40));
        TPZGeoMesh::ElementVec(pTVar5);
        ppTVar8 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                            ((TPZChunkVector<TPZGeoEl_*,_10> *)in_stack_fffffffffffffdb0,
                             (int64_t)in_stack_fffffffffffffda8);
        TPZGeoEl::MaterialId(*ppTVar8);
        CreateGeometricElement
                  (in_stack_00000d10,in_stack_00000d0c,in_stack_00000d08,in_stack_00000d04,
                   in_stack_00000d00,in_stack_00000cf8);
        local_e8 = local_e8 + 1;
      }
      TPZGeoMesh::SetMaxElementId(*(TPZGeoMesh **)(in_RDI + 0x38),0);
      TPZGeoMesh::BuildConnectivity(in_stack_000000b0);
      return *(TPZGeoMesh **)(in_RDI + 0x38);
    }
    for (local_48 = 0; local_48 < local_30; local_48 = local_48 + 1) {
      TPZVec<double>::TPZVec(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      local_90 = 0;
      TPZVec<double>::TPZVec
                ((TPZVec<double> *)in_stack_fffffffffffffda0,(int64_t)in_stack_fffffffffffffd98,
                 (double *)in_stack_fffffffffffffd90);
      local_b8 = 0;
      TPZVec<double>::TPZVec
                ((TPZVec<double> *)in_stack_fffffffffffffda0,(int64_t)in_stack_fffffffffffffd98,
                 (double *)in_stack_fffffffffffffd90);
      dVar9 = local_18 * (double)local_44 + local_10;
      pdVar4 = TPZVec<double>::operator[](&local_68,0);
      *pdVar4 = dVar9;
      TPZVec<double>::TPZVec
                ((TPZVec<double> *)in_stack_fffffffffffffda0,(int64_t)in_stack_fffffffffffffd98,
                 (double *)in_stack_fffffffffffffd90);
      pTVar5 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 0x40))
      ;
      TPZGeoMesh::NodeVec(pTVar5);
      TPZChunkVector<TPZGeoNode,_10>::operator[]
                (&in_stack_fffffffffffffdb0->super_TPZChunkVector<TPZGeoNode,_10>,
                 (int64_t)in_stack_fffffffffffffda8);
      TPZGeoMesh::NodeVec(*(TPZGeoMesh **)(in_RDI + 0x38));
      TPZChunkVector<TPZGeoNode,_10>::operator[]
                (&in_stack_fffffffffffffdb0->super_TPZChunkVector<TPZGeoNode,_10>,
                 (int64_t)in_stack_fffffffffffffda8);
      TPZGeoNode::operator=((TPZGeoNode *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      TPZGeoMesh::NodeVec(*(TPZGeoMesh **)(in_RDI + 0x38));
      TPZChunkVector<TPZGeoNode,_10>::operator[]
                (&in_stack_fffffffffffffdb0->super_TPZChunkVector<TPZGeoNode,_10>,
                 (int64_t)in_stack_fffffffffffffda8);
      TPZGeoNode::GetCoordinates
                ((TPZGeoNode *)in_stack_fffffffffffffda0,(TPZVec<double> *)in_stack_fffffffffffffd98
                );
      pTVar6 = TPZAutoPointer<TPZFunction<double>_>::operator->
                         ((TPZAutoPointer<TPZFunction<double>_> *)(in_RDI + 0x68));
      (**(code **)((long)*pTVar6 + 0x60))(pTVar6,&local_68,&local_b0);
      pdVar4 = TPZVec<double>::operator[](&local_b0,0);
      dVar9 = *pdVar4;
      pdVar4 = TPZVec<double>::operator[](&local_88,0);
      *pdVar4 = dVar9;
      pdVar4 = TPZVec<double>::operator[](&local_b0,1);
      dVar9 = *pdVar4;
      pdVar4 = TPZVec<double>::operator[](&local_88,1);
      *pdVar4 = dVar9;
      pdVar4 = TPZVec<double>::operator[](&local_b0,2);
      dVar9 = *pdVar4;
      pdVar4 = TPZVec<double>::operator[](&local_88,2);
      *pdVar4 = dVar9;
      if (((local_44 + 1) % 2 == 0) && ((*(byte *)(in_RDI + 8) & 1) != 0)) {
        pTVar5 = TPZAutoPointer<TPZGeoMesh>::operator->
                           ((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 0x40));
        iVar1 = TPZGeoMesh::Dimension(pTVar5);
        if (iVar1 != 2) goto LAB_01f69899;
        pdVar4 = TPZVec<double>::operator[](&local_88,0);
        dVar9 = *pdVar4;
        pdVar4 = TPZVec<double>::operator[](&local_d8,0);
        *pdVar4 = *pdVar4 + dVar9;
        pdVar4 = TPZVec<double>::operator[](&local_88,1);
        dVar9 = *pdVar4;
        pdVar4 = TPZVec<double>::operator[](&local_d8,1);
        *pdVar4 = *pdVar4 + dVar9;
        pdVar4 = TPZVec<double>::operator[](&local_88,2);
        dVar9 = *pdVar4;
        pdVar4 = TPZVec<double>::operator[](&local_d8,2);
        *pdVar4 = *pdVar4 + dVar9;
        dVar9 = local_40 * local_18;
        pdVar4 = TPZVec<double>::operator[](&local_d8,2);
        *pdVar4 = dVar9 * 0.5 + *pdVar4;
        local_40 = local_40 * -1.0;
      }
      else {
LAB_01f69899:
        pdVar4 = TPZVec<double>::operator[](&local_88,0);
        dVar9 = *pdVar4;
        pdVar4 = TPZVec<double>::operator[](&local_d8,0);
        *pdVar4 = *pdVar4 + dVar9;
        pdVar4 = TPZVec<double>::operator[](&local_88,1);
        dVar9 = *pdVar4;
        pdVar4 = TPZVec<double>::operator[](&local_d8,1);
        *pdVar4 = *pdVar4 + dVar9;
        pdVar4 = TPZVec<double>::operator[](&local_88,2);
        dVar9 = *pdVar4;
        pdVar4 = TPZVec<double>::operator[](&local_d8,2);
        *pdVar4 = dVar9 + *pdVar4;
      }
      in_stack_fffffffffffffdb0 = TPZGeoMesh::NodeVec(*(TPZGeoMesh **)(in_RDI + 0x38));
      in_stack_fffffffffffffda8 =
           TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&in_stack_fffffffffffffdb0->super_TPZChunkVector<TPZGeoNode,_10>,
                      (int64_t)in_stack_fffffffffffffda8);
      TPZGeoNode::SetCoord
                ((TPZGeoNode *)in_stack_fffffffffffffda0,(TPZVec<double> *)in_stack_fffffffffffffd98
                );
      in_stack_fffffffffffffda0 = TPZGeoMesh::NodeVec(*(TPZGeoMesh **)(in_RDI + 0x38));
      in_stack_fffffffffffffd98 =
           TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&in_stack_fffffffffffffdb0->super_TPZChunkVector<TPZGeoNode,_10>,
                      (int64_t)in_stack_fffffffffffffda8);
      TPZGeoNode::SetNodeId(in_stack_fffffffffffffd98,local_34);
      local_34 = local_34 + 1;
      TPZVec<double>::~TPZVec(in_stack_fffffffffffffd90);
      TPZVec<double>::~TPZVec(in_stack_fffffffffffffd90);
      TPZVec<double>::~TPZVec(in_stack_fffffffffffffd90);
      TPZVec<double>::~TPZVec(in_stack_fffffffffffffd90);
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

TPZGeoMesh * TPZHierarquicalGrid::ComputeExtrusion(REAL t, REAL dt, int n)
{
    fSubBases.Resize(n+1);
    fComputedGeomesh = new TPZGeoMesh;
    int NNodesBase = fBase->NNodes();
    fComputedGeomesh->NodeVec().Resize( (n+1) * NNodesBase);
    
    // Creating new elements
    int nodeId = 0;
    REAL sing = 1.0;
    for(int il = 0; il < (n+1); il++ )
    {
        // copying l extrusions
        // For a while all of them are equal
        //        fSubBases[il] = new TPZGeoMesh(fBase);
        
        for(int inode = 0; inode < NNodesBase; inode++)
        {
            TPZVec<REAL> tpara(1),NewCoordinates_r(3,0.0);
            TPZVec<REAL> NewCoordinates(3,0.0);
            tpara[0] = dt*il+t;
            
            TPZVec<REAL> Coordinates(3,0.0);
            fComputedGeomesh->NodeVec()[inode + il * NNodesBase] =  fBase->NodeVec()[inode];
            //            NewGeomesh->NodeVec()[inode + il*fBase->NNodes()] =  fSubBases[il]->NodeVec()[inode];
            fComputedGeomesh->NodeVec()[inode + il * NNodesBase].GetCoordinates(Coordinates);
            
            fParametricFunction->Execute(tpara,NewCoordinates);
            NewCoordinates_r[0] = REAL(NewCoordinates[0]);
            NewCoordinates_r[1] = REAL(NewCoordinates[1]);
            NewCoordinates_r[2] = REAL(NewCoordinates[2]);
            
            if(((il+1)%2==0 && fNonAffineQ) && fBase->Dimension() == 2){
                Coordinates[0]+=NewCoordinates_r[0];
                Coordinates[1]+=NewCoordinates_r[1];
                Coordinates[2]+=NewCoordinates_r[2];
                Coordinates[2]+= sing*dt/2.0;
                sing *= -1.0;
            }
            else{
                Coordinates[0]+=NewCoordinates_r[0];
                Coordinates[1]+=NewCoordinates_r[1];
                Coordinates[2]+=NewCoordinates_r[2];
            }
            
            fComputedGeomesh->NodeVec()[inode + il * NNodesBase].SetCoord(Coordinates);
            fComputedGeomesh->NodeVec()[inode + il * NNodesBase].SetNodeId(nodeId);
            nodeId++;
        }
    }
    
    fComputedGeomesh->SetMaxNodeId(nodeId);
    
//    int fbasedim = fBase->Dimension();
    
    int elid=0;
    for(int iel = 0; iel < fBase->NElements(); iel++)
    {
        int ielDim      = fBase->ElementVec()[iel]->Dimension();
        int ielMatId    = fBase->ElementVec()[iel]->MaterialId();
        CreateGeometricElement(n,iel,ielDim,ielMatId,elid);
    }
    
    fComputedGeomesh->SetMaxElementId(elid);
    fComputedGeomesh->BuildConnectivity();
    return fComputedGeomesh;
    
}